

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<(anonymous_namespace)::ButtonInfo>::
emplace<(anonymous_namespace)::ButtonInfo>
          (QMovableArrayOps<(anonymous_namespace)::ButtonInfo> *this,qsizetype i,ButtonInfo *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  long in_RSI;
  ButtonInfo *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  ButtonInfo tmp;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1e;
  byte bVar6;
  ButtonInfo *this_00;
  undefined1 local_a0 [152];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::needsDetach
                    ((QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == *(long *)&(in_RDI->rule).font) &&
       (qVar3 = QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::freeSpaceAtEnd
                          ((QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff1e,
                                                   CONCAT24(in_stack_ffffffffffffff1c,
                                                            in_stack_ffffffffffffff18)))),
       qVar3 != 0)) {
      QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::end
                ((QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)in_RDI);
      anon_unknown.dwarf_477e63::ButtonInfo::ButtonInfo
                (in_RDI,(ButtonInfo *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08))
      ;
      *(long *)&(in_RDI->rule).font = *(long *)&(in_RDI->rule).font + 1;
      goto LAB_00446850;
    }
    if ((in_RSI == 0) &&
       (qVar3 = QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::freeSpaceAtBegin
                          ((QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff1e,
                                                   CONCAT24(in_stack_ffffffffffffff1c,
                                                            in_stack_ffffffffffffff18)))),
       qVar3 != 0)) {
      QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::begin
                ((QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)0x446716);
      anon_unknown.dwarf_477e63::ButtonInfo::ButtonInfo
                (in_RDI,(ButtonInfo *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08))
      ;
      *(long *)&(in_RDI->rule).defaultBackground =
           *(long *)&(in_RDI->rule).defaultBackground + -0x98;
      *(long *)&(in_RDI->rule).font = *(long *)&(in_RDI->rule).font + 1;
      goto LAB_00446850;
    }
  }
  memset(local_a0,0xaa,0x98);
  anon_unknown.dwarf_477e63::ButtonInfo::ButtonInfo
            (in_RDI,(ButtonInfo *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  bVar4 = *(long *)&(in_RDI->rule).font != 0;
  uVar5 = bVar4 && in_RSI == 0;
  uVar2 = (uint)(bVar4 && in_RSI == 0);
  bVar6 = uVar5;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::detachAndGrow
            ((QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)this_00,
             (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (ButtonInfo **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff1c,uVar2))),
             (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)
                              CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff1c,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar5,in_stack_ffffffffffffff08));
    Inserter::insertOne((Inserter *)in_RDI,(ButtonInfo *)CONCAT17(uVar5,in_stack_ffffffffffffff08));
    Inserter::~Inserter((Inserter *)in_RDI);
  }
  else {
    QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::begin
              ((QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)0x4467de);
    anon_unknown.dwarf_477e63::ButtonInfo::ButtonInfo
              (in_RDI,(ButtonInfo *)CONCAT17(uVar5,in_stack_ffffffffffffff08));
    *(long *)&(in_RDI->rule).defaultBackground = *(long *)&(in_RDI->rule).defaultBackground + -0x98;
    *(long *)&(in_RDI->rule).font = *(long *)&(in_RDI->rule).font + 1;
  }
  anon_unknown.dwarf_477e63::ButtonInfo::~ButtonInfo((ButtonInfo *)0x446850);
LAB_00446850:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }